

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileBuffer.cpp
# Opt level: O1

bufsize_t AbstractFileBuffer::getReadableSize(QString *path)

{
  char cVar1;
  bufsize_t bVar2;
  QFile fIn;
  long local_18 [2];
  
  if ((path->d).size == 0) {
    bVar2 = 0;
  }
  else {
    QFile::QFile((QFile *)local_18,(QString *)path);
    cVar1 = QFile::open(local_18,1);
    if (cVar1 == '\0') {
      bVar2 = 0;
    }
    else {
      bVar2 = (**(code **)(local_18[0] + 0x80))();
      QFileDevice::close();
    }
    QFile::~QFile((QFile *)local_18);
  }
  return bVar2;
}

Assistant:

bufsize_t AbstractFileBuffer::getReadableSize(const QString &path)
{
    if (!path.length()) return 0;
    QFile fIn(path);
    if (!fIn.open(QIODevice::ReadOnly)) return 0;
    const bufsize_t size = getReadableSize(fIn);
    fIn.close();
    return size;
}